

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O2

void amrex::mlndlap_unimpose_neumann_bc
               (Box *bx,Array4<double> *rhs,Box *nddom,GpuArray<amrex::LinOpBCType,_3U> *lobc,
               GpuArray<amrex::LinOpBCType,_3U> *hibc)

{
  Box *pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  IntVect IVar17;
  IntVect hi;
  IntVect low;
  undefined8 local_b0;
  int local_a8;
  undefined8 local_a0;
  int local_98;
  undefined8 local_94;
  int local_8c;
  uint local_88;
  undefined8 local_80;
  int local_78;
  IntVect *local_70;
  Box *local_68;
  Box *local_60;
  long local_58;
  GpuArray<amrex::LinOpBCType,_3U> *local_50;
  GpuArray<amrex::LinOpBCType,_3U> *local_48;
  int local_40 [3];
  
  local_48 = hibc;
  local_50 = lobc;
  local_60 = nddom;
  local_68 = bx;
  local_70 = &bx->bigend;
  lVar10 = 0;
  auVar15 = _DAT_006f8e80;
  auVar16 = _DAT_006f8e90;
  while (pBVar1 = local_68, lVar10 != 3) {
    local_58 = lVar10;
    if ((local_50->arr[lVar10] == inflow) ||
       (uVar2 = local_a0, uVar3 = local_94, local_50->arr[lVar10] == Neumann)) {
      local_78 = (local_68->smallend).vect[2];
      local_80 = *(undefined8 *)(local_68->smallend).vect;
      local_a8 = local_70->vect[2];
      local_b0 = *(undefined8 *)local_70->vect;
      *(undefined4 *)((long)&local_b0 + lVar10 * 4) = *(undefined4 *)((long)&local_80 + lVar10 * 4);
      local_a0 = *(undefined8 *)(pBVar1->smallend).vect;
      uVar2 = local_a0;
      local_98 = (pBVar1->smallend).vect[2];
      local_8c = local_a8;
      local_94 = local_b0;
      uVar3 = local_94;
      local_88 = (pBVar1->btype).itype | 1 << ((uint)lVar10 & 0x1f);
      if (*(int *)((long)&local_a0 + lVar10 * 4) == (local_60->smallend).vect[lVar10]) {
        local_a0._4_4_ = (int)((ulong)local_a0 >> 0x20);
        local_94._0_4_ = (int)local_b0;
        local_94._4_4_ = (int)((ulong)local_b0 >> 0x20);
        uVar5 = (int)local_94 - (int)local_a0;
        auVar11._4_4_ = 0;
        auVar11._0_4_ = uVar5;
        auVar11._8_4_ = uVar5;
        auVar11._12_4_ = 0;
        auVar11 = auVar11 ^ auVar16;
        for (lVar10 = (long)local_98; (int)lVar10 <= local_a8; lVar10 = lVar10 + 1) {
          lVar9 = rhs->jstride * 8;
          lVar7 = (long)rhs->p +
                  (lVar10 - (rhs->begin).z) * rhs->kstride * 8 +
                  ((long)local_a0._4_4_ - (long)(rhs->begin).y) * lVar9 + (long)(rhs->begin).x * -8
                  + (long)(int)local_a0 * 8 + 8;
          for (lVar6 = (long)local_a0._4_4_; lVar6 <= local_94._4_4_; lVar6 = lVar6 + 1) {
            if ((int)local_a0 <= (int)local_94) {
              uVar8 = 0;
              do {
                auVar13._8_4_ = (int)uVar8;
                auVar13._0_8_ = uVar8;
                auVar13._12_4_ = (int)(uVar8 >> 0x20);
                auVar13 = (auVar13 | auVar15) ^ auVar16;
                if ((bool)(~(auVar11._4_4_ < auVar13._4_4_ ||
                            auVar11._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar11._4_4_) & 1)) {
                  *(double *)(lVar7 + -8 + uVar8 * 8) = *(double *)(lVar7 + -8 + uVar8 * 8) * 0.5;
                }
                if (auVar13._12_4_ <= auVar11._12_4_ &&
                    (auVar13._8_4_ <= auVar11._8_4_ || auVar13._12_4_ != auVar11._12_4_)) {
                  *(double *)(lVar7 + uVar8 * 8) = *(double *)(lVar7 + uVar8 * 8) * 0.5;
                }
                uVar8 = uVar8 + 2;
              } while (((ulong)uVar5 + 2 & 0x1fffffffe) != uVar8);
            }
            lVar7 = lVar7 + lVar9;
          }
        }
      }
    }
    local_94 = uVar3;
    local_a0 = uVar2;
    lVar10 = local_58;
    pBVar1 = local_68;
    if ((local_48->arr[local_58] == inflow) ||
       (uVar2 = local_a0, uVar3 = local_94, local_48->arr[local_58] == Neumann)) {
      local_78 = (local_68->smallend).vect[2];
      local_80 = *(undefined8 *)(local_68->smallend).vect;
      local_a8 = local_70->vect[2];
      local_b0 = *(undefined8 *)local_70->vect;
      IVar17 = Box::type(local_68);
      auVar16 = _DAT_006f8e90;
      auVar15 = _DAT_006f8e80;
      local_40[0] = IVar17.vect[0];
      local_40[1] = IVar17.vect[1];
      local_40[2] = IVar17.vect[2];
      iVar4 = (~local_40[lVar10] & 1U) + *(int *)((long)&local_b0 + lVar10 * 4);
      *(int *)((long)&local_80 + lVar10 * 4) = iVar4;
      *(int *)((long)&local_b0 + lVar10 * 4) = iVar4;
      local_98 = local_78;
      local_a0 = local_80;
      uVar2 = local_a0;
      local_8c = local_a8;
      local_94 = local_b0;
      uVar3 = local_94;
      local_88 = (pBVar1->btype).itype | 1 << ((uint)lVar10 & 0x1f);
      if (*(int *)((long)&local_94 + lVar10 * 4) == (local_60->bigend).vect[lVar10]) {
        local_a0._0_4_ = (int)local_80;
        local_a0._4_4_ = (int)((ulong)local_80 >> 0x20);
        local_94._0_4_ = (int)local_b0;
        local_94._4_4_ = (int)((ulong)local_b0 >> 0x20);
        uVar5 = (int)local_94 - (int)local_a0;
        auVar12._4_4_ = 0;
        auVar12._0_4_ = uVar5;
        auVar12._8_4_ = uVar5;
        auVar12._12_4_ = 0;
        auVar12 = auVar12 ^ _DAT_006f8e90;
        for (lVar10 = (long)local_78; (int)lVar10 <= local_a8; lVar10 = lVar10 + 1) {
          lVar9 = rhs->jstride * 8;
          lVar7 = (long)rhs->p +
                  ((long)local_a0._4_4_ - (long)(rhs->begin).y) * lVar9 +
                  (lVar10 - (rhs->begin).z) * rhs->kstride * 8 + (long)(rhs->begin).x * -8 +
                  (long)(int)local_a0 * 8 + 8;
          for (lVar6 = (long)local_a0._4_4_; lVar6 <= local_94._4_4_; lVar6 = lVar6 + 1) {
            if ((int)local_a0 <= (int)local_94) {
              uVar8 = 0;
              do {
                auVar14._8_4_ = (int)uVar8;
                auVar14._0_8_ = uVar8;
                auVar14._12_4_ = (int)(uVar8 >> 0x20);
                auVar11 = (auVar14 | auVar15) ^ auVar16;
                if ((bool)(~(auVar12._4_4_ < auVar11._4_4_ ||
                            auVar12._0_4_ < auVar11._0_4_ && auVar11._4_4_ == auVar12._4_4_) & 1)) {
                  *(double *)(lVar7 + -8 + uVar8 * 8) = *(double *)(lVar7 + -8 + uVar8 * 8) * 0.5;
                }
                if (auVar11._12_4_ <= auVar12._12_4_ &&
                    (auVar11._8_4_ <= auVar12._8_4_ || auVar11._12_4_ != auVar12._12_4_)) {
                  *(double *)(lVar7 + uVar8 * 8) = *(double *)(lVar7 + uVar8 * 8) * 0.5;
                }
                uVar8 = uVar8 + 2;
              } while (((ulong)uVar5 + 2 & 0x1fffffffe) != uVar8);
            }
            lVar7 = lVar7 + lVar9;
          }
        }
      }
    }
    local_94 = uVar3;
    local_a0 = uVar2;
    lVar10 = local_58 + 1;
  }
  return;
}

Assistant:

inline void
mlndlap_unimpose_neumann_bc (Box const& bx, Array4<Real> const& rhs, Box const& nddom,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                           GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc) noexcept
{
    mlndlap_scale_neumann_bc(0.5, bx, rhs, nddom, lobc, hibc);
}